

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.h
# Opt level: O1

StringTree * __thiscall
kj::StringTree::
concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
          (StringTree *__return_storage_ptr__,StringTree *this,ArrayPtr<const_char> *params,
          ArrayPtr<const_char> *params_1,ArrayPtr<const_char> *params_2,
          FixedArray<char,_1UL> *params_3,ArrayPtr<const_char> *params_4,
          ArrayPtr<const_char> *params_5)

{
  ArrayDisposer *pAVar1;
  Branch *pBVar2;
  char *pcVar3;
  size_t sVar4;
  long lVar5;
  size_t result_2;
  String local_88;
  char *local_68;
  size_t sStack_60;
  size_t local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  size_t sStack_40;
  ArrayPtr<const_char> *local_38;
  
  (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
  (__return_storage_ptr__->branches).size_ = 0;
  (__return_storage_ptr__->text).content.size_ = 0;
  (__return_storage_ptr__->text).content.disposer = (ArrayDisposer *)0x0;
  __return_storage_ptr__->size_ = 0;
  (__return_storage_ptr__->text).content.ptr = (char *)0x0;
  (__return_storage_ptr__->branches).disposer = (ArrayDisposer *)0x0;
  local_68 = (this->text).content.ptr;
  sStack_60 = params->size_;
  local_58 = params_1->size_;
  uStack_50 = 1;
  local_48 = *(undefined8 *)(params_3 + 8);
  sStack_40 = params_4->size_;
  sVar4 = 0;
  lVar5 = 0;
  do {
    sVar4 = sVar4 + *(long *)((long)&local_68 + lVar5);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x30);
  __return_storage_ptr__->size_ = sVar4;
  uStack_50 = 1;
  sVar4 = 0;
  lVar5 = 0;
  do {
    sVar4 = sVar4 + *(long *)((long)&local_68 + lVar5);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x30);
  local_38 = (ArrayPtr<const_char> *)params_3;
  heapString(&local_88,sVar4);
  pcVar3 = (__return_storage_ptr__->text).content.ptr;
  if (pcVar3 != (char *)0x0) {
    sVar4 = (__return_storage_ptr__->text).content.size_;
    (__return_storage_ptr__->text).content.ptr = (char *)0x0;
    (__return_storage_ptr__->text).content.size_ = 0;
    pAVar1 = (__return_storage_ptr__->text).content.disposer;
    (**pAVar1->_vptr_ArrayDisposer)(pAVar1,pcVar3,1,sVar4,sVar4,0);
  }
  (__return_storage_ptr__->text).content.ptr = local_88.content.ptr;
  (__return_storage_ptr__->text).content.size_ = local_88.content.size_;
  (__return_storage_ptr__->text).content.disposer = local_88.content.disposer;
  local_48 = 0;
  sStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = (char *)0x0;
  sStack_60 = 0;
  sVar4 = 0;
  lVar5 = 0;
  do {
    sVar4 = sVar4 + *(long *)((long)&local_68 + lVar5);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x30);
  local_88.content.ptr =
       (char *)_::HeapArrayDisposer::allocateImpl
                         (0x40,sVar4,sVar4,
                          _::HeapArrayDisposer::Allocate_<kj::StringTree::Branch>::construct,
                          ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  local_88.content.disposer = (ArrayDisposer *)&_::HeapArrayDisposer::instance;
  pBVar2 = (__return_storage_ptr__->branches).ptr;
  local_88.content.size_ = sVar4;
  if (pBVar2 != (Branch *)0x0) {
    sVar4 = (__return_storage_ptr__->branches).size_;
    (__return_storage_ptr__->branches).ptr = (Branch *)0x0;
    (__return_storage_ptr__->branches).size_ = 0;
    pAVar1 = (__return_storage_ptr__->branches).disposer;
    (**pAVar1->_vptr_ArrayDisposer)
              (pAVar1,pBVar2,0x40,sVar4,sVar4,
               ArrayDisposer::Dispose_<kj::StringTree::Branch>::destruct);
  }
  (__return_storage_ptr__->branches).ptr = (Branch *)local_88.content.ptr;
  (__return_storage_ptr__->branches).size_ = local_88.content.size_;
  (__return_storage_ptr__->branches).disposer = local_88.content.disposer;
  pcVar3 = (char *)(__return_storage_ptr__->text).content.size_;
  if (pcVar3 != (char *)0x0) {
    pcVar3 = (__return_storage_ptr__->text).content.ptr;
  }
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,pcVar3,0,(ArrayPtr<const_char> *)this,params,params_1,
             (FixedArray<char,_1UL> *)params_2,local_38,params_4);
  return __return_storage_ptr__;
}

Assistant:

StringTree StringTree::concat(Params&&... params) {
  StringTree result;
  result.size_ = _::sum({params.size()...});
  result.text = heapString(
      _::sum({StringTree::flatSize(kj::fwd<Params>(params))...}));
  result.branches = heapArray<StringTree::Branch>(
      _::sum({StringTree::branchCount(kj::fwd<Params>(params))...}));
  result.fill(result.text.begin(), 0, kj::fwd<Params>(params)...);
  return result;
}